

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::SC
          (AbstractContentContext *this,double *inColorComponents,int inColorComponentsLength)

{
  EStatusCode EVar1;
  allocator<char> local_41;
  string local_40;
  int local_20;
  int local_1c;
  int i;
  int inColorComponentsLength_local;
  double *inColorComponents_local;
  AbstractContentContext *this_local;
  
  local_1c = inColorComponentsLength;
  _i = inColorComponents;
  inColorComponents_local = (double *)this;
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    PrimitiveObjectsWriter::WriteDouble(&this->mPrimitiveWriter,_i[local_20],eTokenSeparatorSpace);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SC",&local_41);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  EVar1 = GetCurrentStatusCode(this);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::SC(double* inColorComponents, int inColorComponentsLength)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	for(int i=0;i<inColorComponentsLength;++i)
		mPrimitiveWriter.WriteDouble(inColorComponents[i]);
	mPrimitiveWriter.WriteKeyword("SC");
	return GetCurrentStatusCode();
}